

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O1

QSet<QWidget_*> * __thiscall QSet<QWidget_*>::unite(QSet<QWidget_*> *this,QSet<QWidget_*> *other)

{
  ulong uVar1;
  size_t sVar2;
  Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *pDVar3;
  size_t sVar4;
  Data *pDVar5;
  Entry *pEVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QHashDummyValue local_59;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (other->q_hash).d;
  if ((pDVar5 != (Data *)0x0) &&
     ((uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i < 2)) {
    pDVar3 = (this->q_hash).d;
    if (pDVar3 == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) {
      sVar2 = 0;
    }
    else {
      sVar2 = pDVar3->size;
    }
    if (pDVar5 == (Data *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar4 = pDVar5->size;
    }
    if ((long)sVar2 < (long)sVar4) {
      (this->q_hash).d = pDVar5;
      (other->q_hash).d = pDVar3;
      if (pDVar3 == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) {
LAB_00404f89:
        pDVar3 = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
LAB_00404f8c:
        uVar7 = 0;
      }
      else {
        if ((uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
          if (pDVar3 == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) {
            pDVar5 = (Data *)0x0;
LAB_00405086:
            uVar7 = 0;
          }
          else {
            if (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i) {
              pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::detached
                                 (pDVar3);
              (other->q_hash).d = pDVar3;
            }
            pDVar5 = (other->q_hash).d;
            if (pDVar5->spans->offsets[0] != 0xff) goto LAB_00405086;
            uVar1 = 1;
            do {
              uVar7 = uVar1;
              if (pDVar5->numBuckets == uVar7) {
                pDVar5 = (Data *)0x0;
                uVar7 = 0;
                break;
              }
              uVar1 = uVar7 + 1;
            } while (pDVar5->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
          }
          if (pDVar5 != (Data *)0x0 || uVar7 != 0) {
            do {
              pEVar6 = pDVar5->spans[uVar7 >> 7].entries +
                       pDVar5->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f];
              local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QHash<QWidget*,QHashDummyValue>::tryEmplace_impl<QWidget*const&>
                        ((TryEmplaceResult *)local_58,(QHash<QWidget*,QHashDummyValue> *)this,
                         (QWidget **)pEVar6);
              if (local_58[0x10] == false) {
                *(undefined8 *)
                 (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
                 [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                  [(uint)local_58._8_8_ & 0x7f]].storage.data =
                     *(undefined8 *)(pEVar6->storage).data;
              }
              do {
                if (pDVar5->numBuckets - 1 == uVar7) {
                  pDVar5 = (Data *)0x0;
                  uVar7 = 0;
                  break;
                }
                uVar7 = uVar7 + 1;
              } while (pDVar5->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
            } while ((pDVar5 != (Data *)0x0) || (uVar7 != 0));
          }
          goto LAB_00404f10;
        }
        if (pDVar3 == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0)
        goto LAB_00404f89;
        if (pDVar3->spans->offsets[0] != 0xff) goto LAB_00404f8c;
        uVar1 = 1;
        do {
          uVar7 = uVar1;
          if (pDVar3->numBuckets == uVar7) {
            pDVar3 = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
            uVar7 = 0;
            break;
          }
          uVar1 = uVar7 + 1;
        } while (pDVar3->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
      }
      if (pDVar3 != (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 || uVar7 != 0) {
        do {
          pEVar6 = pDVar3->spans[uVar7 >> 7].entries +
                   pDVar3->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f];
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QHash<QWidget*,QHashDummyValue>::tryEmplace_impl<QWidget*const&>
                    ((TryEmplaceResult *)local_58,(QHash<QWidget*,QHashDummyValue> *)this,
                     (QWidget **)pEVar6);
          if (local_58[0x10] == false) {
            *(undefined8 *)
             (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
             [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
              [(uint)local_58._8_8_ & 0x7f]].storage.data = *(undefined8 *)(pEVar6->storage).data;
          }
          do {
            if (pDVar3->numBuckets - 1 == uVar7) {
              pDVar3 = (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0;
              uVar7 = 0;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (pDVar3->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
        } while ((pDVar3 != (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0) ||
                (uVar7 != 0));
      }
      goto LAB_00404f10;
    }
  }
  if ((this->q_hash).d == pDVar5) goto LAB_00404f10;
  if (pDVar5 == (Data *)0x0) {
    pDVar5 = (Data *)0x0;
LAB_00404e72:
    uVar7 = 0;
  }
  else {
    if (pDVar5->spans->offsets[0] != 0xff) goto LAB_00404e72;
    uVar1 = 1;
    do {
      uVar7 = uVar1;
      if (pDVar5->numBuckets == uVar7) {
        pDVar5 = (Data *)0x0;
        uVar7 = 0;
        break;
      }
      uVar1 = uVar7 + 1;
    } while (pDVar5->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
  }
  if (pDVar5 != (Data *)0x0 || uVar7 != 0) {
    do {
      local_58._0_8_ =
           *(undefined8 *)
            pDVar5->spans[uVar7 >> 7].entries[pDVar5->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f]]
            .storage.data;
      QHash<QWidget*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QWidget*,QHashDummyValue> *)this,(QWidget **)local_58,&local_59);
      do {
        if (pDVar5->numBuckets - 1 == uVar7) {
          uVar7 = 0;
          pDVar5 = (Data *)0x0;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (pDVar5->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    } while (uVar7 != 0 || pDVar5 != (Data *)0x0);
  }
LAB_00404f10:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

Q_INLINE_TEMPLATE auto QSet<T>::unite(QSet &&other) -> QSet&
{
    if (other.isDetached() && size() < other.size()) {

        // We can change the state of `other`, so take the smaller *this and
        // insert it into the larger `other`, making sure we take equivalent
        // elements from *this:

        swap(other);

        // Now: iterate over `other`, insert into *this, making sure we take
        //      equivalent elements from `other`:

        if (other.isDetached()) { // can move elements from `other`
            for (auto &e : other)
                _emplace_or_overwrite(std::move(e));
        } else { // need to copy elements from `other`
            for (const auto &e : std::as_const(other))
                _emplace_or_overwrite(e);
        }

        return *this;
    }

    // in all other cases, the lvalue overload is not worse:
    return unite(other);
}